

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall
re2::Regexp::ParseState::PushRepeatOp(ParseState *this,RegexpOp op,StringPiece *s,bool nongreedy)

{
  RegexpStatus *pRVar1;
  ParseFlags parse_flags;
  bool bVar2;
  ParseState *this_00;
  Regexp *pRVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  ParseState *this_01;
  
  if ((this->stacktop_ == (Regexp *)0x0) || (0x15 < this->stacktop_->op_)) {
    pRVar1 = this->status_;
    pRVar1->code_ = kRegexpRepeatArgument;
    (pRVar1->error_arg_).ptr_ = s->ptr_;
    (pRVar1->error_arg_).length_ = s->length_;
    bVar2 = false;
  }
  else {
    parse_flags = this->flags_ ^ NonGreedy;
    if (!nongreedy) {
      parse_flags = this->flags_;
    }
    this_00 = (ParseState *)operator_new(0x28);
    this_01 = this_00;
    Regexp((Regexp *)this_00,op,parse_flags);
    *(uint16 *)&this_00->field_0x6 = 1;
    pRVar3 = this->stacktop_;
    ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_)[1] =
         (anon_union_8_2_3df47e5c_for_Regexp_7)pRVar3->down_;
    pRVar3 = FinishRegexp(this_01,pRVar3);
    if (*(ushort *)&this_00->field_0x6 < 2) {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_;
    }
    else {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)
               ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_)->submany_;
    }
    paVar4->subone_ = pRVar3;
    bVar2 = ComputeSimple((Regexp *)this_00);
    *(bool *)((long)&this_00->flags_ + 1) = bVar2;
    this->stacktop_ = (Regexp *)this_00;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Regexp::ParseState::PushRepeatOp(RegexpOp op, const StringPiece& s,
                                      bool nongreedy) {
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;
  Regexp* re = new Regexp(op, fl);
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  return true;
}